

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.cpp
# Opt level: O2

StatisticObject __thiscall Clasp::SolverStats::at(SolverStats *this,char *k)

{
  ExtendedStats *obj;
  int iVar1;
  StatisticObject SVar2;
  
  obj = this->extra;
  if (obj != (ExtendedStats *)0x0) {
    iVar1 = strncmp(k,"extra",5);
    if (iVar1 == 0) {
      if (k[5] != '\0') {
        if (k[5] != '.') goto LAB_0016c5b8;
        if (k[6] != '\0') {
          SVar2 = ExtendedStats::at(obj,k + 6);
          return (StatisticObject)SVar2.handle_;
        }
      }
      SVar2 = StatisticObject::map<Clasp::ExtendedStats>(obj);
      return (StatisticObject)SVar2.handle_;
    }
  }
LAB_0016c5b8:
  SVar2 = CoreStats::at(&this->super_CoreStats,k);
  return (StatisticObject)SVar2.handle_;
}

Assistant:

StatisticObject SolverStats::at(const char* k) const {
	if (extra && matchPath(k, "extra")) {
		return !*k ? StatisticObject::map(extra) : extra->at(k);
	}
	else {
		return CoreStats::at(k);
	}
}